

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
::remove_values(btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  byte bVar1;
  bool bVar2;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *pbVar3;
  undefined1 local_24;
  undefined1 local_23;
  field_type j_1;
  field_type j;
  field_type src_i;
  field_type orig_finish;
  allocator_type *alloc_local;
  field_type to_erase_local;
  field_type i_local;
  btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_local;
  
  value_destroy_n(this,i,to_erase,alloc);
  bVar1 = finish(this);
  transfer_n(this,(long)(int)((uint)bVar1 - (uint)(byte)(i + to_erase)),(ulong)i,
             (ulong)(byte)(i + to_erase),this,alloc);
  bVar2 = is_internal(this);
  if (bVar2) {
    for (local_23 = 0; local_23 < to_erase; local_23 = local_23 + 1) {
      pbVar3 = child(this,i + local_23 + '\x01');
      clear_and_delete(pbVar3,alloc);
    }
    local_24 = i + to_erase;
    while (local_24 = local_24 + 1, local_24 <= bVar1) {
      pbVar3 = child(this,local_24);
      set_child(this,local_24 - to_erase,pbVar3);
      clear_child(this,local_24);
    }
  }
  set_finish(this,bVar1 - to_erase);
  return;
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (field_type j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (field_type j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}